

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_constant.cpp
# Opt level: O2

void duckdb::ConstantFillFunction<float>
               (ColumnSegment *segment,Vector *result,idx_t start_idx,idx_t count)

{
  data_ptr_t pdVar1;
  idx_t iVar2;
  float fVar3;
  
  pdVar1 = result->data;
  fVar3 = NumericStats::GetMin<float>(&(segment->stats).statistics);
  for (iVar2 = 0; count != iVar2; iVar2 = iVar2 + 1) {
    *(float *)(pdVar1 + iVar2 * 4 + start_idx * 4) = fVar3;
  }
  return;
}

Assistant:

void ConstantFillFunction(ColumnSegment &segment, Vector &result, idx_t start_idx, idx_t count) {
	auto &nstats = segment.stats.statistics;

	auto data = FlatVector::GetData<T>(result);
	auto constant_value = NumericStats::GetMin<T>(nstats);
	for (idx_t i = 0; i < count; i++) {
		data[start_idx + i] = constant_value;
	}
}